

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biptlist.cpp
# Opt level: O1

vector<Pt2i,_std::allocator<Pt2i>_> * __thiscall BiPtList::backPoints(BiPtList *this)

{
  _Elt_pointer pPVar1;
  vector<Pt2i,_std::allocator<Pt2i>_> *this_00;
  ulong uVar2;
  ulong uVar3;
  int iVar4;
  value_type *__x;
  value_type *pvVar5;
  value_type *pvVar6;
  _Map_pointer ppPVar7;
  
  this_00 = (vector<Pt2i,_std::allocator<Pt2i>_> *)operator_new(0x18);
  (this_00->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this_00->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this_00->super__Vector_base<Pt2i,_std::allocator<Pt2i>_>)._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pPVar1 = (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.super__Deque_impl_data
           ._M_start._M_cur;
  ppPVar7 = (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.
            super__Deque_impl_data._M_start._M_node;
  uVar2 = ((long)pPVar1 -
           (long)(this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.
                 super__Deque_impl_data._M_start._M_first >> 3) + (long)this->start + 1;
  if (uVar2 < 0x40) {
    pvVar5 = (this->pts).super__Deque_base<Pt2i,_std::allocator<Pt2i>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
    __x = pPVar1 + (long)this->start + 1;
  }
  else {
    uVar3 = uVar2 >> 6 | 0xfc00000000000000;
    if (0 < (long)uVar2) {
      uVar3 = uVar2 >> 6;
    }
    ppPVar7 = ppPVar7 + uVar3;
    __x = *ppPVar7 + uVar2 + uVar3 * -0x40;
    pvVar5 = *ppPVar7 + 0x40;
  }
  if (this->start - this->cpt < -1) {
    iVar4 = 0;
    do {
      pvVar6 = __x + 1;
      if (pvVar6 == pvVar5) {
        pvVar6 = ppPVar7[1];
        ppPVar7 = ppPVar7 + 1;
        pvVar5 = pvVar6 + 0x40;
      }
      std::vector<Pt2i,_std::allocator<Pt2i>_>::push_back(this_00,__x);
      iVar4 = iVar4 + 1;
      __x = pvVar6;
    } while (iVar4 < ~this->start + this->cpt);
  }
  return this_00;
}

Assistant:

std::vector<Pt2i> *BiPtList::backPoints () const
{
  std::vector<Pt2i> *res = new std::vector<Pt2i> ();
  std::deque<Pt2i>::const_iterator it = pts.begin ();
  it += start + 1;
  for (int i = 0; i < cpt - start - 1; i++) res->push_back (*it++);
  return res;
}